

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3ed8c::QueueReader::~QueueReader(QueueReader *this)

{
  Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this_00;
  _Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false> __ptr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false> _Var1;
  vector<signed_char,_std::allocator<signed_char>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false> local_18;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__QueueReader_00185000;
  local_18._M_head_impl =
       (this->tmp_)._M_t.
       super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
       .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
       _M_head_impl;
  _Var1._M_head_impl = in_RAX;
  if (local_18._M_head_impl != (vector<signed_char,_std::allocator<signed_char>_> *)0x0) {
    this_00 = (this->queue_).
              super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (this->tmp_)._M_t.
    super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
    _M_head_impl = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
    Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
              (this_00,(unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                        *)&local_18);
    if (local_18._M_head_impl != (vector<signed_char,_std::allocator<signed_char>_> *)0x0) {
      std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>::operator()
                ((default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_> *)
                 &local_18,local_18._M_head_impl);
    }
    local_18._M_head_impl = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
    __ptr_00._M_head_impl =
         (this->tmp_)._M_t.
         super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
         .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
         _M_head_impl;
    _Var1._M_head_impl = local_18._M_head_impl;
    if (__ptr_00._M_head_impl != (vector<signed_char,_std::allocator<signed_char>_> *)0x0) {
      std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>::operator()
                ((default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_> *)
                 &this->tmp_,__ptr_00._M_head_impl);
      _Var1._M_head_impl = local_18._M_head_impl;
    }
  }
  local_18._M_head_impl = _Var1._M_head_impl;
  (this->tmp_)._M_t.
  super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
  _M_head_impl = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
  this_01 = (this->queue_).
            super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  decoder::Reader::~Reader(&this->super_Reader);
  return;
}

Assistant:

virtual ~QueueReader() {
    // Return read buffer if needed
    if (tmp_) {
      queue_->pushRead(std::move(tmp_));
    }
  }